

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

int namingConventions::namingConventionsVariables
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  pointer pcVar1;
  string *name_00;
  string *psVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  AST *this;
  ulong uVar6;
  string *oldName;
  ulong uVar7;
  pointer pbVar8;
  vector<AST_*,_std::allocator<AST_*>_> vars;
  vector<Pda_*,_std::allocator<Pda_*>_> varPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newVarNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allVarNames;
  string name;
  vector<AST_*,_std::allocator<AST_*>_> local_130;
  vector<Pda_*,_std::allocator<Pda_*>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  string local_a0;
  string local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  pointer local_58;
  undefined1 local_50 [32];
  
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pbVar8 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (inputFiles->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_60 = inputFiles;
  if (pbVar8 != local_58) {
    do {
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this = (AST *)operator_new(8);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar1 = (pbVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar1,pcVar1 + pbVar8->_M_string_length);
      AST::AST(this,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"vbn/NamingConvTests/outputs/yeeters.dot","");
      AST::toDot(this,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"variable","");
      AST::find(&local_130,this,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      name_00 = local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 0;
        uVar7 = 1;
        do {
          AST::yield_abi_cxx11_
                    ((string *)local_50,
                     local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6]);
          iVar5 = isalpha((int)*(char *)local_50._0_8_);
          if ((((iVar5 != 0) &&
               (iVar5 = std::__cxx11::string::compare((char *)local_50), iVar5 != 0)) &&
              (iVar5 = std::__cxx11::string::compare((char *)local_50), iVar5 != 0)) &&
             (bVar4 = findNameInVector(&local_d8,(string *)local_50), !bVar4)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_d8,(string *)local_50);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_f8,(string *)local_50);
          }
          if ((Pda *)local_50._0_8_ != (Pda *)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          bVar4 = uVar7 < (ulong)((long)local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
          uVar6 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
          name_00 = local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar2 = local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (bVar4);
      }
      for (; pbVar3 = local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          name_00 !=
          local_f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; name_00 = name_00 + 1) {
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar2;
        local_50._0_8_ = makeNamePda(name_00);
        std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                  ((vector<Pda*,std::allocator<Pda*>> *)&local_118,(Pda **)local_50);
        psVar2 = local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
      }
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar2;
      if (local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.super__Vector_base<AST_*,_std::allocator<AST_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_58);
  }
  adjustForAllFiles(local_60,&local_d8,&local_118,false);
  if (local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return 0;
}

Assistant:

std::string
namingConventions::editToNewName(std::string &word, const std::string &oldName, const std::string &correctName) {
    unsigned int correctCount = 0;
    unsigned int start = 0;
    unsigned int end = 0;
    unsigned int misses = 0;
    std::string newName;
    unsigned int functionCall = 0;

    bool found = false;
    unsigned int oldname_i = 0;

    // zoekt start en eindpunt van gezochte naam in stukje tekst, telt het aantal misses, etc..
    for (unsigned int c = 0; c < word.size(); ++c) {
      if(word[c] == '('){
        functionCall = c;
      }

        if (word[c] == oldName[oldname_i] && !found) {
            if (correctCount == oldName.size() - 1) {
                end = c;
                found = true;
                if(correctCount == 0){
                  start = c;
                }
            } else {
                correctCount += 1;
                oldname_i += 1;
                if (correctCount == 1) {
                    start = c;
                }
            }

        } else {
            correctCount = 0;
            found = false;
            oldname_i = 0;
            if(word[c] != '(' && word[c] != ')' && word[c] != ';' )
            misses += 1;
        }
    }

    // past de tekst aan
    if(misses > 0){
      if(functionCall != 0 && found){
        unsigned int pos = 0;
        while (pos != functionCall + 1) { //variable in function call
          newName += word[pos];
          pos += 1;
        }
        newName += correctName;
        return newName;

      }else if(functionCall != 0){  // function being called
        newName = correctName;
        while (functionCall < word.size()) {
          newName += word[functionCall];
          functionCall += 1;
        }
        return newName;
      }
      return word;
    }
    unsigned int pos = 0;
    while (pos != start) {
        newName += word[pos];
        pos += 1;
    }
    newName += correctName;
    pos = end + 1;
    while (pos < word.size()) {
        newName += word[pos];
        pos += 1;
    }
    return newName;

}